

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cradix-improved.c
# Opt level: O2

void insertion_sort(uchar **strings,int n,size_t depth)

{
  byte bVar1;
  byte bVar2;
  uchar *puVar3;
  uchar **ppuVar4;
  uchar **ppuVar5;
  size_t sVar6;
  
  ppuVar4 = strings;
  do {
    if (n < 2) {
      return;
    }
    ppuVar4 = ppuVar4 + 1;
    n = n + -1;
    puVar3 = *ppuVar4;
    ppuVar5 = ppuVar4;
    while (strings < ppuVar5) {
      sVar6 = depth;
      while( true ) {
        bVar1 = ppuVar5[-1][sVar6];
        bVar2 = puVar3[sVar6];
        if ((bVar1 == 0) || (bVar1 != bVar2)) break;
        sVar6 = sVar6 + 1;
      }
      if (bVar1 <= bVar2) break;
      *ppuVar5 = ppuVar5[-1];
      ppuVar5 = ppuVar5 + -1;
    }
    *ppuVar5 = puVar3;
  } while( true );
}

Assistant:

static void
insertion_sort(unsigned char** strings, int n, size_t depth)
{
	for (unsigned char** i = strings + 1; --n > 0; ++i) {
		unsigned char** j = i;
		unsigned char* tmp = *i;
		while (j > strings) {
			unsigned char* s = *(j-1)+depth;
			unsigned char* t = tmp+depth;
			while (*s == *t && *s) {
				++s;
				++t;
			}
			if (*s <= *t) break;
			*j = *(j-1);
			--j;
		}
		*j = tmp;
	}
}